

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O0

void __thiscall LexerError::Run(LexerError *this)

{
  pointer *this_00;
  EvalString *this_01;
  Test *pTVar1;
  bool bVar2;
  undefined1 local_78 [8];
  string err;
  EvalString eval;
  Lexer lexer;
  LexerError *this_local;
  
  this_00 = &eval.parsed_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Lexer::Lexer((Lexer *)this_00,"foo$\nbad $");
  this_01 = (EvalString *)((long)&err.field_2 + 8);
  EvalString::EvalString(this_01);
  std::__cxx11::string::string((string *)local_78);
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadVarValue((Lexer *)this_00,this_01,(string *)local_78);
  bVar2 = testing::Test::Check
                    (pTVar1,(bool)(~bVar2 & 1),
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
                     ,0x4b,"lexer.ReadVarValue(&eval, &err)");
  pTVar1 = g_current_test;
  if (bVar2) {
    bVar2 = std::operator==("input:2: bad $-escape (literal $ must be written as $$)\nbad $\n    ^ near here"
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_78);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
               ,0x4f,
               "\"input:2: bad $-escape (literal $ must be written as $$)\\n\" \"bad $\\n\" \"    ^ near here\" == err"
              );
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_78);
  EvalString::~EvalString((EvalString *)((long)&err.field_2 + 8));
  return;
}

Assistant:

TEST(Lexer, Error) {
  Lexer lexer("foo$\nbad $");
  EvalString eval;
  string err;
  ASSERT_FALSE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("input:2: bad $-escape (literal $ must be written as $$)\n"
            "bad $\n"
            "    ^ near here"
            , err);
}